

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::QueryCapabilities
          (ConsumerEndpointImpl *this,QueryCapabilitiesCallback *callback)

{
  undefined1 local_70 [8];
  TracingServiceCapabilities caps;
  QueryCapabilitiesCallback *callback_local;
  ConsumerEndpointImpl *this_local;
  
  caps._has_field_.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)callback;
  protos::gen::TracingServiceCapabilities::TracingServiceCapabilities
            ((TracingServiceCapabilities *)local_70);
  protos::gen::TracingServiceCapabilities::set_has_query_capabilities
            ((TracingServiceCapabilities *)local_70,true);
  protos::gen::TracingServiceCapabilities::set_has_trace_config_output_path
            ((TracingServiceCapabilities *)local_70,true);
  protos::gen::TracingServiceCapabilities::add_observable_events
            ((TracingServiceCapabilities *)local_70,
             ObservableEvents_Type_TYPE_DATA_SOURCES_INSTANCES);
  protos::gen::TracingServiceCapabilities::add_observable_events
            ((TracingServiceCapabilities *)local_70,
             ObservableEvents_Type_TYPE_ALL_DATA_SOURCES_STARTED);
  std::function<void_(const_perfetto::protos::gen::TracingServiceCapabilities_&)>::operator()
            (callback,(TracingServiceCapabilities *)local_70);
  protos::gen::TracingServiceCapabilities::~TracingServiceCapabilities
            ((TracingServiceCapabilities *)local_70);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::QueryCapabilities(
    QueryCapabilitiesCallback callback) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  TracingServiceCapabilities caps;
  caps.set_has_query_capabilities(true);
  caps.set_has_trace_config_output_path(true);
  caps.add_observable_events(ObservableEvents::TYPE_DATA_SOURCES_INSTANCES);
  caps.add_observable_events(ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED);
  static_assert(ObservableEvents::Type_MAX ==
                    ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED,
                "");
  callback(caps);
}